

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O2

int32_t uchar_swapNames_63(UDataSwapper *ds,void *inData,int32_t length,void *outData,
                          UErrorCode *pErrorCode)

{
  uint32_t *__src;
  void *__dest;
  char cVar1;
  UDataSwapFn *pUVar2;
  uint uVar3;
  uint16_t uVar4;
  ushort uVar5;
  int16_t iVar6;
  uint16_t tokenCount;
  int32_t iVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  int iVar12;
  void *pvVar13;
  uint16_t *puVar14;
  size_t sVar15;
  byte *pbVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  int32_t iVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  void *pvVar25;
  ulong uVar26;
  byte *pbVar27;
  byte bVar28;
  uint8_t *puVar29;
  char *pcVar30;
  uint uVar31;
  bool bVar32;
  void *local_748;
  uint16_t lengths [33];
  uint16_t offsets [33];
  uint8_t trailMap [256];
  uint8_t map [256];
  int16_t tokens [512];
  
  iVar7 = udata_swapDataHeader_63(ds,inData,length,outData,pErrorCode);
  if (pErrorCode == (UErrorCode *)0x0) {
    return 0;
  }
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
  bVar28 = *(byte *)((long)inData + 0xd);
  if ((((bVar28 != 0x6e || *(byte *)((long)inData + 0xc) != 0x75) ||
       (bVar28 = 0x6e, *(char *)((long)inData + 0xe) != 'a')) ||
      (*(char *)((long)inData + 0xf) != 'm')) || (*(char *)((long)inData + 0x10) != '\x01')) {
    udata_printError_63(ds,
                        "uchar_swapNames(): data format %02x.%02x.%02x.%02x (format version %02x) is not recognized as unames.icu\n"
                        ,(ulong)*(byte *)((long)inData + 0xc),(ulong)bVar28,
                        (ulong)*(byte *)((long)inData + 0xe),(ulong)*(byte *)((long)inData + 0xf),
                        (uint)*(byte *)((long)inData + 0x10));
LAB_0019ab05:
    *pErrorCode = U_UNSUPPORTED_ERROR;
    return 0;
  }
  lVar19 = (long)iVar7;
  __src = (uint32_t *)((long)inData + lVar19);
  if (length < 0) {
    uVar9 = (*ds->readUInt32)(__src[3]);
    uVar8 = (*ds->readUInt32)(*(uint32_t *)((long)__src + (ulong)uVar9));
    uVar17 = uVar9 + 4;
    while (bVar32 = uVar8 != 0, uVar8 = uVar8 - 1, bVar32) {
      uVar4 = (*ds->readUInt16)(*(uint16_t *)((long)__src + (ulong)uVar17 + 10));
      uVar17 = uVar17 + uVar4;
    }
  }
  else {
    uVar31 = length - iVar7;
    if (((int)uVar31 < 0x14) || (uVar8 = (*ds->readUInt32)(__src[3]), uVar31 < uVar8)) {
      udata_printError_63(ds,"uchar_swapNames(): too few bytes (%d after header) for unames.icu\n",
                          (ulong)uVar31);
LAB_0019aacf:
      *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      return 0;
    }
    __dest = (void *)(lVar19 + (long)outData);
    if (inData != outData) {
      memcpy(__dest,__src,(ulong)uVar31);
    }
    uVar9 = (*ds->readUInt32)(*__src);
    uVar10 = (*ds->readUInt32)(__src[1]);
    uVar11 = (*ds->readUInt32)(__src[2]);
    (*ds->swapArray32)(ds,__src,0x10,__dest,pErrorCode);
    uVar4 = (*ds->readUInt16)((uint16_t)__src[4]);
    (*ds->swapArray16)(ds,__src + 4,2,(void *)((long)__dest + 0x10),pErrorCode);
    local_748 = (void *)((long)__src + 0x12);
    uVar5 = 0x200;
    if (uVar4 < 0x200) {
      uVar5 = uVar4;
    }
    uVar23 = (ulong)uVar5;
    for (uVar24 = 0; uVar23 != uVar24; uVar24 = uVar24 + 1) {
      iVar6 = udata_readInt16_63(ds,*(int16_t *)((long)local_748 + uVar24 * 2));
      tokens[uVar24] = iVar6;
    }
    for (; uVar23 < 0x200; uVar23 = uVar23 + 1) {
      tokens[uVar23] = 0;
    }
    makeTokenMap(ds,tokens,uVar4,map,pErrorCode);
    tokenCount = uVar4 - 0x100;
    if (uVar4 < 0x100) {
      tokenCount = 0;
    }
    makeTokenMap(ds,tokens + 0x100,tokenCount,trailMap,pErrorCode);
    if (U_ZERO_ERROR < *pErrorCode) {
      return 0;
    }
    uVar17 = (uint)uVar4;
    pvVar13 = uprv_malloc_63((ulong)(uVar17 * 2));
    if (pvVar13 == (void *)0x0) {
      udata_printError_63(ds,"out of memory swapping %u unames.icu tokens\n",(ulong)uVar4);
      *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
      return 0;
    }
    uVar24 = 0x100;
    if (uVar17 < 0x100) {
      uVar24 = (ulong)uVar4;
    }
    iVar20 = (int)uVar24;
    for (uVar23 = 0; uVar24 != uVar23; uVar23 = uVar23 + 1) {
      (*ds->swapArray16)(ds,local_748,2,(void *)((long)pvVar13 + (ulong)map[uVar23] * 2),pErrorCode)
      ;
      local_748 = (void *)((long)local_748 + 2);
    }
    pvVar25 = (void *)((long)inData + lVar19 + uVar24 * 2 + 0x12);
    for (; (uVar17 - iVar20) + (int)uVar23 != uVar24; uVar24 = uVar24 + 1) {
      (*ds->swapArray16)(ds,pvVar25,2,
                         (void *)((long)pvVar13 +
                                 (ulong)trailMap[uVar24 & 0xff] * 2 +
                                 (ulong)((uint)uVar24 & 0x7fffff00) * 2),pErrorCode);
      pvVar25 = (void *)((long)pvVar25 + 2);
    }
    memcpy((void *)((long)__dest + 0x12),pvVar13,(ulong)(uVar17 * 2));
    uprv_free_63(pvVar13);
    udata_swapInvStringBlock_63
              (ds,(void *)((long)__src + (ulong)uVar9),uVar10 - uVar9,
               (void *)((ulong)uVar9 + (long)__dest),pErrorCode);
    if (U_ZERO_ERROR < *pErrorCode) {
      udata_printError_63(ds,"uchar_swapNames(token strings) failed\n");
      return 0;
    }
    uVar24 = (ulong)uVar10;
    uVar4 = (*ds->readUInt16)(*(uint16_t *)((long)__src + uVar24));
    (*ds->swapArray16)(ds,(void *)((long)__src + uVar24),(uint)uVar4 * 6 + 2,
                       (void *)(uVar24 + (long)__dest),pErrorCode);
    if (ds->inCharset != ds->outCharset) {
      puVar29 = (uint8_t *)((ulong)uVar11 + (long)__dest);
      pbVar27 = (byte *)((long)__src + (ulong)uVar11);
      for (uVar17 = uVar8 - uVar11; 0x20 < uVar17; uVar17 = uVar17 - iVar22) {
        pbVar16 = icu_63::expandGroupLengths(pbVar27,offsets,lengths);
        puVar29 = puVar29 + ((long)pbVar16 - (long)pbVar27);
        iVar20 = (uint)lengths[0x1f] + (uint)offsets[0x1f];
        iVar22 = (int)((long)pbVar16 - (long)pbVar27) + iVar20;
        for (; iVar20 != 0; iVar20 = iVar20 + iVar12) {
          bVar28 = *pbVar16;
          *puVar29 = map[bVar28];
          if (tokens[bVar28] == -2) {
            pbVar27 = pbVar16 + 1;
            pbVar16 = pbVar16 + 2;
            puVar29[1] = trailMap[*pbVar27];
            puVar29 = puVar29 + 2;
            iVar12 = -2;
          }
          else {
            pbVar16 = pbVar16 + 1;
            puVar29 = puVar29 + 1;
            iVar12 = -1;
          }
        }
        pbVar27 = pbVar16;
      }
    }
    uVar24 = (ulong)uVar8;
    uVar9 = (*ds->readUInt32)(*(uint32_t *)((long)__src + uVar24));
    (*ds->swapArray32)(ds,(void *)((long)__src + uVar24),4,(void *)(uVar24 + (long)__dest),
                       pErrorCode);
    uVar17 = uVar8 + 4;
    for (uVar18 = 0; uVar18 != uVar9; uVar18 = uVar18 + 1) {
      if (uVar31 < uVar17) {
        udata_printError_63(ds,
                            "uchar_swapNames(): too few bytes (%d after header) for unames.icu algorithmic range %u\n"
                            ,(ulong)uVar31);
        goto LAB_0019aacf;
      }
      uVar24 = (ulong)uVar17;
      pvVar13 = (void *)((long)__src + uVar24);
      pvVar25 = (void *)((long)__dest + uVar24);
      puVar14 = (uint16_t *)((long)__src + uVar24 + 10);
      uVar4 = (*ds->readUInt16)(*puVar14);
      (*ds->swapArray32)(ds,pvVar13,8,pvVar25,pErrorCode);
      (*ds->swapArray16)(ds,puVar14,2,(void *)((long)__dest + uVar24 + 10),pErrorCode);
      bVar28 = *(byte *)((long)__src + uVar24 + 8);
      if (bVar28 == 1) {
        bVar28 = *(byte *)((long)pvVar13 + 9);
        uVar3 = (uint)bVar28 * 2;
        uVar26 = (ulong)uVar3;
        (*ds->swapArray16)(ds,(void *)((long)pvVar13 + 0xc),uVar3,(void *)((long)pvVar25 + 0xc),
                           pErrorCode);
        iVar20 = (uint)uVar4 + (uint)bVar28 * -2;
        uVar23 = (ulong)(iVar20 - 0xc);
        pcVar30 = (char *)((long)inData + uVar23 + uVar24 + uVar26 + lVar19 + 0xb);
        uVar24 = 0;
        do {
          if (uVar23 == uVar24) {
            iVar21 = 0;
            goto LAB_0019aff6;
          }
          uVar24 = uVar24 + 1;
          cVar1 = *pcVar30;
          pcVar30 = pcVar30 + -1;
        } while (cVar1 != '\0');
        iVar21 = (iVar20 - (int)uVar24) + -0xb;
LAB_0019aff6:
        (*ds->swapInvChars)(ds,(void *)((long)pvVar13 + uVar26 + 0xc),iVar21,
                            (void *)((long)pvVar25 + uVar26 + 0xc),pErrorCode);
      }
      else {
        if (bVar28 != 0) {
          udata_printError_63(ds,"uchar_swapNames(): unknown type %u of algorithmic range %u\n",
                              (ulong)bVar28,(ulong)uVar18);
          goto LAB_0019ab05;
        }
        pUVar2 = ds->swapInvChars;
        sVar15 = strlen((char *)((long)pvVar13 + 0xc));
        (*pUVar2)(ds,(char *)((long)pvVar13 + 0xc),(int32_t)sVar15,(void *)((long)pvVar25 + 0xc),
                  pErrorCode);
        if (U_ZERO_ERROR < *pErrorCode) {
          udata_printError_63(ds,"uchar_swapNames(prefix string of algorithmic range %u) failed\n",
                              (ulong)uVar18);
          return 0;
        }
      }
      uVar17 = uVar17 + uVar4;
    }
  }
  return uVar17 + iVar7;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uchar_swapNames(const UDataSwapper *ds,
                const void *inData, int32_t length, void *outData,
                UErrorCode *pErrorCode) {
    const UDataInfo *pInfo;
    int32_t headerSize;

    const uint8_t *inBytes;
    uint8_t *outBytes;

    uint32_t tokenStringOffset, groupsOffset, groupStringOffset, algNamesOffset,
             offset, i, count, stringsCount;

    const AlgorithmicRange *inRange;
    AlgorithmicRange *outRange;

    /* udata_swapDataHeader checks the arguments */
    headerSize=udata_swapDataHeader(ds, inData, length, outData, pErrorCode);
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    /* check data format and format version */
    pInfo=(const UDataInfo *)((const char *)inData+4);
    if(!(
        pInfo->dataFormat[0]==0x75 &&   /* dataFormat="unam" */
        pInfo->dataFormat[1]==0x6e &&
        pInfo->dataFormat[2]==0x61 &&
        pInfo->dataFormat[3]==0x6d &&
        pInfo->formatVersion[0]==1
    )) {
        udata_printError(ds, "uchar_swapNames(): data format %02x.%02x.%02x.%02x (format version %02x) is not recognized as unames.icu\n",
                         pInfo->dataFormat[0], pInfo->dataFormat[1],
                         pInfo->dataFormat[2], pInfo->dataFormat[3],
                         pInfo->formatVersion[0]);
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    inBytes=(const uint8_t *)inData+headerSize;
    outBytes=(uint8_t *)outData+headerSize;
    if(length<0) {
        algNamesOffset=ds->readUInt32(((const uint32_t *)inBytes)[3]);
    } else {
        length-=headerSize;
        if( length<20 ||
            (uint32_t)length<(algNamesOffset=ds->readUInt32(((const uint32_t *)inBytes)[3]))
        ) {
            udata_printError(ds, "uchar_swapNames(): too few bytes (%d after header) for unames.icu\n",
                             length);
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
    }

    if(length<0) {
        /* preflighting: iterate through algorithmic ranges */
        offset=algNamesOffset;
        count=ds->readUInt32(*((const uint32_t *)(inBytes+offset)));
        offset+=4;

        for(i=0; i<count; ++i) {
            inRange=(const AlgorithmicRange *)(inBytes+offset);
            offset+=ds->readUInt16(inRange->size);
        }
    } else {
        /* swap data */
        const uint16_t *p;
        uint16_t *q, *temp;

        int16_t tokens[512];
        uint16_t tokenCount;

        uint8_t map[256], trailMap[256];

        /* copy the data for inaccessible bytes */
        if(inBytes!=outBytes) {
            uprv_memcpy(outBytes, inBytes, length);
        }

        /* the initial 4 offsets first */
        tokenStringOffset=ds->readUInt32(((const uint32_t *)inBytes)[0]);
        groupsOffset=ds->readUInt32(((const uint32_t *)inBytes)[1]);
        groupStringOffset=ds->readUInt32(((const uint32_t *)inBytes)[2]);
        ds->swapArray32(ds, inBytes, 16, outBytes, pErrorCode);

        /*
         * now the tokens table
         * it needs to be permutated along with the compressed name strings
         */
        p=(const uint16_t *)(inBytes+16);
        q=(uint16_t *)(outBytes+16);

        /* read and swap the tokenCount */
        tokenCount=ds->readUInt16(*p);
        ds->swapArray16(ds, p, 2, q, pErrorCode);
        ++p;
        ++q;

        /* read the first 512 tokens and make the token maps */
        if(tokenCount<=512) {
            count=tokenCount;
        } else {
            count=512;
        }
        for(i=0; i<count; ++i) {
            tokens[i]=udata_readInt16(ds, p[i]);
        }
        for(; i<512; ++i) {
            tokens[i]=0; /* fill the rest of the tokens array if tokenCount<512 */
        }
        makeTokenMap(ds, tokens, tokenCount, map, pErrorCode);
        makeTokenMap(ds, tokens+256, (uint16_t)(tokenCount>256 ? tokenCount-256 : 0), trailMap, pErrorCode);
        if(U_FAILURE(*pErrorCode)) {
            return 0;
        }

        /*
         * swap and permutate the tokens
         * go through a temporary array to support in-place swapping
         */
        temp=(uint16_t *)uprv_malloc(tokenCount*2);
        if(temp==NULL) {
            udata_printError(ds, "out of memory swapping %u unames.icu tokens\n",
                             tokenCount);
            *pErrorCode=U_MEMORY_ALLOCATION_ERROR;
            return 0;
        }

        /* swap and permutate single-/lead-byte tokens */
        for(i=0; i<tokenCount && i<256; ++i) {
            ds->swapArray16(ds, p+i, 2, temp+map[i], pErrorCode);
        }

        /* swap and permutate trail-byte tokens */
        for(; i<tokenCount; ++i) {
            ds->swapArray16(ds, p+i, 2, temp+(i&0xffffff00)+trailMap[i&0xff], pErrorCode);
        }

        /* copy the result into the output and free the temporary array */
        uprv_memcpy(q, temp, tokenCount*2);
        uprv_free(temp);

        /*
         * swap the token strings but not a possible padding byte after
         * the terminating NUL of the last string
         */
        udata_swapInvStringBlock(ds, inBytes+tokenStringOffset, (int32_t)(groupsOffset-tokenStringOffset),
                                    outBytes+tokenStringOffset, pErrorCode);
        if(U_FAILURE(*pErrorCode)) {
            udata_printError(ds, "uchar_swapNames(token strings) failed\n");
            return 0;
        }

        /* swap the group table */
        count=ds->readUInt16(*((const uint16_t *)(inBytes+groupsOffset)));
        ds->swapArray16(ds, inBytes+groupsOffset, (int32_t)((1+count*3)*2),
                           outBytes+groupsOffset, pErrorCode);

        /*
         * swap the group strings
         * swap the string bytes but not the nibble-encoded string lengths
         */
        if(ds->inCharset!=ds->outCharset) {
            uint16_t offsets[LINES_PER_GROUP+1], lengths[LINES_PER_GROUP+1];

            const uint8_t *inStrings, *nextInStrings;
            uint8_t *outStrings;

            uint8_t c;

            inStrings=inBytes+groupStringOffset;
            outStrings=outBytes+groupStringOffset;

            stringsCount=algNamesOffset-groupStringOffset;

            /* iterate through string groups until only a few padding bytes are left */
            while(stringsCount>32) {
                nextInStrings=expandGroupLengths(inStrings, offsets, lengths);

                /* move past the length bytes */
                stringsCount-=(uint32_t)(nextInStrings-inStrings);
                outStrings+=nextInStrings-inStrings;
                inStrings=nextInStrings;

                count=offsets[31]+lengths[31]; /* total number of string bytes in this group */
                stringsCount-=count;

                /* swap the string bytes using map[] and trailMap[] */
                while(count>0) {
                    c=*inStrings++;
                    *outStrings++=map[c];
                    if(tokens[c]!=-2) {
                        --count;
                    } else {
                        /* token lead byte: swap the trail byte, too */
                        *outStrings++=trailMap[*inStrings++];
                        count-=2;
                    }
                }
            }
        }

        /* swap the algorithmic ranges */
        offset=algNamesOffset;
        count=ds->readUInt32(*((const uint32_t *)(inBytes+offset)));
        ds->swapArray32(ds, inBytes+offset, 4, outBytes+offset, pErrorCode);
        offset+=4;

        for(i=0; i<count; ++i) {
            if(offset>(uint32_t)length) {
                udata_printError(ds, "uchar_swapNames(): too few bytes (%d after header) for unames.icu algorithmic range %u\n",
                                 length, i);
                *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                return 0;
            }

            inRange=(const AlgorithmicRange *)(inBytes+offset);
            outRange=(AlgorithmicRange *)(outBytes+offset);
            offset+=ds->readUInt16(inRange->size);

            ds->swapArray32(ds, inRange, 8, outRange, pErrorCode);
            ds->swapArray16(ds, &inRange->size, 2, &outRange->size, pErrorCode);
            switch(inRange->type) {
            case 0:
                /* swap prefix string */
                ds->swapInvChars(ds, inRange+1, (int32_t)uprv_strlen((const char *)(inRange+1)),
                                    outRange+1, pErrorCode);
                if(U_FAILURE(*pErrorCode)) {
                    udata_printError(ds, "uchar_swapNames(prefix string of algorithmic range %u) failed\n",
                                     i);
                    return 0;
                }
                break;
            case 1:
                {
                    /* swap factors and the prefix and factor strings */
                    uint32_t factorsCount;

                    factorsCount=inRange->variant;
                    p=(const uint16_t *)(inRange+1);
                    q=(uint16_t *)(outRange+1);
                    ds->swapArray16(ds, p, (int32_t)(factorsCount*2), q, pErrorCode);

                    /* swap the strings, up to the last terminating NUL */
                    p+=factorsCount;
                    q+=factorsCount;
                    stringsCount=(uint32_t)((inBytes+offset)-(const uint8_t *)p);
                    while(stringsCount>0 && ((const uint8_t *)p)[stringsCount-1]!=0) {
                        --stringsCount;
                    }
                    ds->swapInvChars(ds, p, (int32_t)stringsCount, q, pErrorCode);
                }
                break;
            default:
                udata_printError(ds, "uchar_swapNames(): unknown type %u of algorithmic range %u\n",
                                 inRange->type, i);
                *pErrorCode=U_UNSUPPORTED_ERROR;
                return 0;
            }
        }
    }

    return headerSize+(int32_t)offset;
}